

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void rename_bb_insn(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn)

{
  void **ppvVar1;
  ushort uVar2;
  VARR_ssa_edge_t *pVVar3;
  size_t sVar4;
  _IO_FILE *p_Var5;
  MIR_func_t pMVar6;
  VARR_char *pVVar7;
  MIR_context_t ctx;
  MIR_reg_t MVar8;
  MIR_type_t type;
  MIR_reg_t MVar9;
  char *pcVar10;
  char *pcVar11;
  undefined1 *puVar12;
  size_t *psVar13;
  MIR_insn_t pMVar14;
  size_t sVar15;
  size_t sVar16;
  ulong uVar17;
  long lVar18;
  FILE *__s;
  _IO_FILE *p_Var19;
  char extraout_DL;
  uint extraout_EDX;
  gen_ctx *pgVar20;
  gen_ctx *__stream;
  FILE *pFVar21;
  bb_insn_t_conflict pbVar22;
  gen_ctx *pgVar23;
  MIR_insn_t in_R8;
  ulong in_R9;
  uint *puVar24;
  VARR_size_t *pVVar25;
  int iVar26;
  uint uVar27;
  FILE *pFVar28;
  int iVar30;
  gen_ctx_t unaff_R15;
  long lVar32;
  gen_ctx_t pgVar33;
  bb_insn_t_conflict pbVar34;
  bool bVar35;
  char acStack_e0 [40];
  gen_ctx *pgStack_b8;
  MIR_insn_t pMStack_b0;
  FILE *pFStack_a8;
  gen_ctx_t pgStack_a0;
  gen_ctx_t pgStack_98;
  FILE *pFStack_90;
  uint local_80;
  MIR_reg_t local_7c;
  gen_ctx *local_78;
  size_t local_70;
  undefined1 local_64 [12];
  MIR_insn_t local_58;
  bb_insn_t_conflict local_50;
  size_t local_48;
  anon_union_32_12_57d33f68_for_u *local_40;
  gen_ctx *local_38;
  FILE *pFVar29;
  gen_ctx_t pgVar31;
  
  local_58 = bb_insn->insn;
  local_38 = (gen_ctx *)(*(ulong *)&local_58->field_0x18 >> 0x20);
  local_64._4_8_ = local_58->ops;
  local_40 = &local_58->ops[0].u;
  local_70 = -(long)local_38;
  pgVar20 = (gen_ctx *)0x0;
  local_50 = bb_insn;
  local_48 = local_70;
LAB_0016148b:
  do {
    do {
      do {
        sVar4 = local_48;
        local_80 = (uint)unaff_R15;
        bVar35 = true;
        if (pgVar20 < local_38) {
          puVar24 = (uint *)((long)pgVar20 * 0x30 + (long)local_40);
          lVar32 = 0;
          do {
            lVar18 = lVar32;
            local_70 = (long)pgVar20->call_used_hard_regs + lVar18 + -0x68;
            pFStack_90 = (FILE *)0x1614d2;
            MIR_insn_op_mode(gen_ctx->ctx,local_58,local_70,(int *)local_64);
            if ((local_64._0_4_ != 0) && ((char)puVar24[-2] != '\v')) {
              if ((char)puVar24[-2] != '\x02') {
                pFStack_90 = (FILE *)0x1617f1;
                __assert_fail("op_ref->mode == MIR_OP_VAR",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x4ff,
                              "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                             );
              }
              local_80 = *puVar24;
              pgVar20 = (gen_ctx *)((long)pgVar20->call_used_hard_regs + lVar18 + -0x67);
              bVar35 = false;
              goto LAB_0016151f;
            }
            lVar32 = lVar18 + 1;
            puVar24 = puVar24 + 0xc;
          } while ((long)pgVar20->call_used_hard_regs + lVar32 + sVar4 + -0x68 != 0);
          local_70 = (size_t)(uint)((int)pgVar20 + -1 + (int)lVar32);
          pgVar20 = (gen_ctx *)((long)pgVar20->call_used_hard_regs + lVar18 + -0x67);
          bVar35 = true;
        }
LAB_0016151f:
        pbVar22 = local_50;
        uVar27 = local_80;
        if (bVar35) {
          return;
        }
        unaff_R15 = (gen_ctx_t)(ulong)local_80;
      } while (local_80 < 0x22);
      lVar32 = (long)(int)local_70;
      pFVar28 = (FILE *)((MIR_op_t *)(local_64._4_8_ + lVar32 * 0x30))->data;
    } while ((pFVar28 != (FILE *)0x0) && (*(char *)&pFVar28->_IO_read_end != '\0'));
    local_78 = pgVar20;
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      pFStack_90 = (FILE *)0x161587;
      fprintf((FILE *)gen_ctx->debug_file,"  Start def insn %-5lu",(ulong)local_50->index);
      pgVar20 = local_78;
      pFStack_90 = (FILE *)0x161599;
      print_bb_insn(gen_ctx,pbVar22,0);
    }
    pMVar14 = (MIR_insn_t)(local_64._4_8_ + lVar32 * 0x30);
    pbVar22 = (bb_insn_t_conflict)(ulong)uVar27;
    __s = (FILE *)0x0;
    pFStack_90 = (FILE *)0x1615b0;
    __stream = gen_ctx;
    MVar8 = get_new_ssa_reg(gen_ctx,uVar27,0x40,0);
    if (pFVar28 != (FILE *)0x0) {
      pVVar3 = gen_ctx->ssa_ctx->ssa_edges_to_process;
      pFVar21 = (FILE *)local_64;
      pFVar29 = pFVar28;
      local_7c = MVar8;
      if ((pVVar3 == (VARR_ssa_edge_t *)0x0) || (pVVar3->varr == (ssa_edge_t_conflict *)0x0)) {
LAB_00161800:
        pFStack_90 = (FILE *)get_new_ssa_reg;
        rename_bb_insn_cold_4();
        pVVar25 = __stream->ssa_ctx->curr_reg_indexes;
        pgVar23 = __stream;
        pgVar31 = gen_ctx;
        pgVar33 = unaff_R15;
        pgStack_b8 = pgVar20;
        pMStack_b0 = pMVar14;
        pFStack_a8 = pFVar29;
        pgStack_a0 = gen_ctx;
        pgStack_98 = unaff_R15;
        pFStack_90 = pFVar21;
        if (pVVar25 == (VARR_size_t *)0x0) goto LAB_0016189d;
        pgVar31 = (gen_ctx_t)((ulong)__s & 0xffffffff);
        iVar30 = (int)__s;
        pFVar29 = (FILE *)((ulong)pbVar22 & 0xffffffff);
        iVar26 = (int)pbVar22;
        pgVar33 = (gen_ctx_t)((ulong)pbVar22 & 0xffffffff);
        break;
      }
      pVVar3->els_num = 0;
      for (pMVar14 = (MIR_insn_t)pMVar14->data; pMVar14 != (MIR_insn_t)0x0;
          pMVar14 = (MIR_insn_t)pMVar14->ops[0].data) {
        if (*(char *)&(pMVar14->insn_link).next == '\0') {
          pFVar29 = (FILE *)gen_ctx->ssa_ctx->ssa_edges_to_process;
          __stream = (gen_ctx *)pFVar29->_IO_read_end;
          __s = (FILE *)local_64;
          pFVar21 = pFVar28;
          unaff_R15 = gen_ctx;
          if (__stream == (gen_ctx *)0x0) goto LAB_001617fb;
          pcVar10 = (char *)(*(long *)pFVar29 + 1);
          if (pFVar29->_IO_read_ptr < pcVar10) {
            pbVar22 = (bb_insn_t_conflict)((long)(pcVar10 + ((ulong)pcVar10 >> 1)) * 8);
            pFStack_90 = (FILE *)0x161646;
            pcVar11 = (char *)realloc(__stream,(size_t)pbVar22);
            pFVar29->_IO_read_end = pcVar11;
            pFVar29->_IO_read_ptr = pcVar10 + ((ulong)pcVar10 >> 1);
            pgVar20 = local_78;
          }
          lVar32 = *(long *)pFVar29;
          __s = (FILE *)pFVar29->_IO_read_end;
          *(long *)pFVar29 = lVar32 + 1;
          *(MIR_insn_t *)(&__s->_flags + lVar32 * 2) = pMVar14;
          *(undefined1 *)&(pMVar14->insn_link).next = 1;
          __stream = (gen_ctx *)gen_ctx->debug_file;
          unaff_R15 = (gen_ctx_t)(ulong)local_80;
          if ((__stream != (gen_ctx *)0x0) && (1 < gen_ctx->debug_level)) {
            in_R8 = (MIR_insn_t)(ulong)*(uint *)((long)pMVar14->data + 0xc);
            in_R9 = (ulong)*(uint *)((long)&(pMVar14->insn_link).next + 4);
            pFStack_90 = (FILE *)0x1616bf;
            fprintf((FILE *)__stream,"     Adding ssa edge: def %lu:%d -> use %lu:%d:\n      ",
                    (ulong)*(uint *)((long)&(((pMVar14->insn_link).prev)->insn_link).prev + 4),
                    (ulong)*(ushort *)((long)&(pMVar14->insn_link).next + 2));
            pFStack_90 = (FILE *)0x1616ce;
            print_bb_insn(gen_ctx,(bb_insn_t_conflict)(pMVar14->insn_link).prev,0);
            __s = (FILE *)gen_ctx->debug_file;
            pFStack_90 = (FILE *)0x1616e8;
            fwrite("     ",5,1,__s);
            pbVar22 = (bb_insn_t_conflict)pMVar14->data;
            pFStack_90 = (FILE *)0x1616f6;
            __stream = gen_ctx;
            print_bb_insn(gen_ctx,pbVar22,0);
          }
        }
      }
      if (local_7c != 0xffffffff) {
        do {
          MVar8 = local_7c;
          pVVar3 = gen_ctx->ssa_ctx->ssa_edges_to_process;
          if (pVVar3 == (VARR_ssa_edge_t *)0x0) {
            pFStack_90 = (FILE *)0x1617f6;
            rename_bb_insn_cold_3();
LAB_001617f6:
            pFStack_90 = (FILE *)0x1617fb;
            rename_bb_insn_cold_2();
            pFVar21 = (FILE *)local_64;
            pFVar29 = pFVar28;
LAB_001617fb:
            pFStack_90 = (FILE *)0x161800;
            rename_bb_insn_cold_1();
            goto LAB_00161800;
          }
          __s = (FILE *)pVVar3->els_num;
          if (__s != (FILE *)0x0) {
            if (pVVar3->varr == (ssa_edge_t_conflict *)0x0) goto LAB_001617f6;
            pVVar3->els_num = (size_t)(__s[-1]._unused2 + 0x13);
            pFVar28 = (FILE *)pVVar3->varr[(long)(__s[-1]._unused2 + 0x13)];
          }
          pgVar20 = local_78;
          if (__s == (FILE *)0x0) break;
          pMVar14 = (MIR_insn_t)**(undefined8 **)pFVar28;
          pgVar20 = (gen_ctx *)(ulong)local_7c;
          pFStack_90 = (FILE *)0x161770;
          rename_op_reg(gen_ctx,(MIR_op_t *)
                                ((long)&(*(MIR_insn_t *)pFVar28->_IO_read_ptr)->ops[0].data +
                                (ulong)((uint)*(ushort *)((long)&pFVar28->_IO_read_end + 2) * 0x30))
                        ,(MIR_reg_t)unaff_R15,local_7c,*(MIR_insn_t *)pFVar28->_IO_read_ptr,
                        (int)in_R9);
          pbVar22 = (bb_insn_t_conflict)(pMVar14->ops + *(uint *)((long)&pFVar28->_IO_read_end + 4))
          ;
          __s = (FILE *)(ulong)MVar8;
          pFStack_90 = (FILE *)0x161791;
          __stream = gen_ctx;
          in_R8 = pMVar14;
          rename_op_reg(gen_ctx,(MIR_op_t *)pbVar22,(MIR_reg_t)unaff_R15,MVar8,pMVar14,(int)in_R9);
        } while( true );
      }
      goto LAB_0016148b;
    }
    if (MVar8 != 0xffffffff) {
      pFStack_90 = (FILE *)0x1617be;
      in_R8 = local_58;
      rename_op_reg(gen_ctx,(MIR_op_t *)pMVar14,uVar27,MVar8,local_58,(int)in_R9);
    }
  } while( true );
  while( true ) {
    if (pgVar23 == (gen_ctx *)0x0) {
      get_new_ssa_reg_cold_1();
      goto LAB_00161b38;
    }
    puVar12 = (undefined1 *)((long)&((gen_ctx_t)pVVar25->els_num)->ctx + 1);
    if ((undefined1 *)pVVar25->size < puVar12) {
      pbVar22 = (bb_insn_t_conflict)((long)(puVar12 + ((ulong)puVar12 >> 1)) * 8);
      psVar13 = (size_t *)realloc(pgVar23,(size_t)pbVar22);
      pVVar25->varr = psVar13;
      pVVar25->size = (size_t)(puVar12 + ((ulong)puVar12 >> 1));
    }
    sVar4 = pVVar25->els_num;
    __s = (FILE *)pVVar25->varr;
    pVVar25->els_num = sVar4 + 1;
    *(undefined8 *)(&__s->_flags + sVar4 * 2) = 0;
    pVVar25 = __stream->ssa_ctx->curr_reg_indexes;
    pgVar20 = __stream;
    if (pVVar25 == (VARR_size_t *)0x0) break;
    MVar8 = (MIR_reg_t)__s;
    pgVar23 = (gen_ctx *)pVVar25->varr;
    if (pgVar33 < (gen_ctx_t)pVVar25->els_num) goto LAB_001618a2;
  }
LAB_0016189d:
  __stream = pgVar20;
  iVar26 = (int)pFVar29;
  iVar30 = (int)pgVar31;
  MVar8 = (MIR_reg_t)__s;
  get_new_ssa_reg_cold_9();
LAB_001618a2:
  if (pgVar23 == (gen_ctx *)0x0) {
LAB_00161b38:
    get_new_ssa_reg_cold_8();
LAB_00161b3d:
    get_new_ssa_reg_cold_7();
LAB_00161b42:
    get_new_ssa_reg_cold_6();
LAB_00161b47:
    pMVar14 = in_R8;
    pgVar20 = pgVar23;
    get_new_ssa_reg_cold_5();
LAB_00161b4c:
    get_new_ssa_reg_cold_3();
LAB_00161b51:
    get_new_ssa_reg_cold_2();
  }
  else {
    p_Var5 = (_IO_FILE *)pgVar23->call_used_hard_regs[(long)((long)&pgVar33[-1].spot2attr + 3)];
    pgVar23->call_used_hard_regs[(long)((long)&pgVar33[-1].spot2attr + 3)] =
         (bitmap_t)((long)&p_Var5->_flags + 1);
    if ((iVar30 == 0) && (p_Var5 == (_IO_FILE *)0x0)) {
      return;
    }
    pgVar20 = (gen_ctx *)__stream->ctx;
    pMVar6 = (__stream->curr_func_item->u).func;
    uVar27 = iVar26 - 0x21;
    pbVar22 = (bb_insn_t_conflict)(ulong)uVar27;
    p_Var19 = p_Var5;
    type = MIR_reg_type((MIR_context_t)pgVar20,uVar27,pMVar6);
    pcVar10 = MIR_reg_name((MIR_context_t)pgVar20,uVar27,pMVar6);
    pgVar23 = pgVar20;
    pMVar14 = (MIR_insn_t)MIR_reg_hard_reg_name((MIR_context_t)pgVar20,uVar27,pMVar6);
    MVar8 = (MIR_reg_t)p_Var19;
    pVVar7 = __stream->ssa_ctx->reg_name;
    if ((pVVar7 == (VARR_char *)0x0) || (pcVar11 = pVVar7->varr, pcVar11 == (char *)0x0))
    goto LAB_00161b3d;
    pVVar7->els_num = 0;
    sVar15 = strlen(pcVar10);
    if (pVVar7->size < sVar15) {
      pbVar34 = (bb_insn_t_conflict)((sVar15 >> 1) + sVar15);
      pbVar22 = pbVar34;
      pcVar11 = (char *)realloc(pcVar11,(size_t)pbVar34);
      pVVar7->varr = pcVar11;
      pVVar7->size = (size_t)pbVar34;
    }
    if (sVar15 != 0) {
      sVar16 = 0;
      do {
        p_Var19 = (_IO_FILE *)pVVar7->els_num;
        puVar12 = (undefined1 *)((long)&p_Var19->_flags + 1);
        pVVar7->els_num = (size_t)puVar12;
        pbVar22 = (bb_insn_t_conflict)CONCAT71((int7)((ulong)puVar12 >> 8),pcVar10[sVar16]);
        pVVar7->varr[(long)p_Var19] = pcVar10[sVar16];
        sVar16 = sVar16 + 1;
      } while (sVar15 != sVar16);
    }
    MVar8 = (MIR_reg_t)p_Var19;
    pVVar7 = __stream->ssa_ctx->reg_name;
    pgVar23 = (gen_ctx *)pVVar7->varr;
    if (pgVar23 == (gen_ctx *)0x0) goto LAB_00161b42;
    uVar17 = pVVar7->els_num + 1;
    if (pVVar7->size < uVar17) {
      sVar15 = (uVar17 >> 1) + uVar17;
      pcVar10 = (char *)realloc(pgVar23,sVar15);
      pVVar7->varr = pcVar10;
      pVVar7->size = sVar15;
    }
    sVar4 = pVVar7->els_num;
    pcVar10 = pVVar7->varr;
    pVVar7->els_num = sVar4 + 1;
    pcVar10[sVar4] = extraout_DL;
    pbVar22 = (bb_insn_t_conflict)0x1bb553;
    sprintf(acStack_e0,"%lu",p_Var5);
    pVVar7 = __stream->ssa_ctx->reg_name;
    sVar15 = strlen(acStack_e0);
    MVar8 = (MIR_reg_t)pcVar10;
    pgVar23 = (gen_ctx *)pVVar7->varr;
    if (pgVar23 == (gen_ctx *)0x0) goto LAB_00161b47;
    lVar32 = sVar15 + 1;
    uVar17 = pVVar7->els_num + lVar32;
    if (pVVar7->size < uVar17) {
      pbVar34 = (bb_insn_t_conflict)((uVar17 >> 1) + uVar17);
      pbVar22 = pbVar34;
      pcVar11 = (char *)realloc(pgVar23,(size_t)pbVar34);
      pVVar7->varr = pcVar11;
      pVVar7->size = (size_t)pbVar34;
    }
    if (lVar32 != 0) {
      lVar18 = 0;
      do {
        pcVar10 = (char *)pVVar7->els_num;
        pVVar7->els_num = (size_t)(pcVar10 + 1);
        pbVar22 = (bb_insn_t_conflict)CONCAT71((int7)((ulong)(pcVar10 + 1) >> 8),acStack_e0[lVar18])
        ;
        pVVar7->varr[(long)pcVar10] = acStack_e0[lVar18];
        lVar18 = lVar18 + 1;
      } while (lVar32 != lVar18);
    }
    MVar8 = (MIR_reg_t)pcVar10;
    pVVar7 = __stream->ssa_ctx->reg_name;
    if (pMVar14 != (MIR_insn_t)0x0) {
      if (pVVar7 == (VARR_char *)0x0) goto LAB_00161b4c;
      pcVar10 = pVVar7->varr;
      MVar9 = MIR_new_global_func_reg((MIR_context_t)pgVar20,pMVar6,type,pcVar10,(char *)pMVar14);
      MVar8 = (MIR_reg_t)pcVar10;
      uVar27 = MVar9 + 0x21;
      pgVar23 = (gen_ctx *)__stream->tied_regs;
      pbVar22 = (bb_insn_t_conflict)((ulong)uVar27 + 1);
      pgVar20 = pgVar23;
      bitmap_expand((bitmap_t)pgVar23,(size_t)pbVar22);
      if (pgVar23 != (gen_ctx *)0x0) {
        ppvVar1 = &pgVar23->curr_func_item->data + (uVar27 >> 6);
        *ppvVar1 = (void *)((ulong)*ppvVar1 | 1L << ((ulong)uVar27 & 0x3f));
        goto LAB_00161b0c;
      }
      goto LAB_00161b51;
    }
    if (pVVar7 != (VARR_char *)0x0) {
      MVar8 = MIR_new_func_reg((MIR_context_t)pgVar20,pMVar6,type,pVVar7->varr);
      uVar27 = MVar8 + 0x21;
LAB_00161b0c:
      if ((uVar27 != 0xffffffff) && (__stream->curr_cfg->max_var < uVar27)) {
        __stream->curr_cfg->max_var = uVar27;
      }
      return;
    }
  }
  get_new_ssa_reg_cold_4();
  if (extraout_EDX < 0x22) {
    __assert_fail("reg > ST1_HARD_REG",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x5d8,
                  "void rename_op_reg(gen_ctx_t, MIR_op_t *, MIR_reg_t, MIR_reg_t, MIR_insn_t, int)"
                 );
  }
  ctx = pgVar20->ctx;
  uVar2._0_1_ = pbVar22->gvn_val_const_p;
  uVar2._1_1_ = pbVar22->alloca_flag;
  if ((undefined1)uVar2 == '\v') {
LAB_00161b9c:
    bVar35 = *(uint *)&(pbVar22->bb_insn_link).prev == extraout_EDX;
    if (bVar35) {
      *(MIR_reg_t *)&(pbVar22->bb_insn_link).prev = MVar8;
    }
    if (*(uint *)((long)&(pbVar22->bb_insn_link).prev + 4) != extraout_EDX) goto LAB_00161bb8;
    *(MIR_reg_t *)((long)&(pbVar22->bb_insn_link).prev + 4) = MVar8;
  }
  else {
    bVar35 = false;
    if ((undefined1)uVar2 != '\x02') goto LAB_00161bb8;
    if (((anon_union_32_12_57d33f68_for_u *)&pbVar22->mem_index)->reg != extraout_EDX) {
      if ((uVar2 & 0xff) != 0xb) goto LAB_00161bb8;
      goto LAB_00161b9c;
    }
    ((anon_union_32_12_57d33f68_for_u *)&pbVar22->mem_index)->reg = MVar8;
  }
  bVar35 = true;
LAB_00161bb8:
  if (((bVar35) && (pFVar28 = (FILE *)pgVar20->debug_file, pFVar28 != (FILE *)0x0)) &&
     (1 < pgVar20->debug_level)) {
    pMVar6 = (pgVar20->curr_func_item->u).func;
    pcVar10 = MIR_reg_name(ctx,extraout_EDX - 0x21,pMVar6);
    pcVar11 = MIR_reg_name(ctx,MVar8 - 0x21,pMVar6);
    fprintf(pFVar28,"    Change %s to %s in insn %-5lu",pcVar10,pcVar11,
            (ulong)*(uint *)((long)pMVar14->data + 0xc));
    print_bb_insn(pgVar20,(bb_insn_t_conflict)pMVar14->data,0);
    return;
  }
  return;
}

Assistant:

static void rename_bb_insn (gen_ctx_t gen_ctx, bb_insn_t bb_insn) {
  int op_num;
  MIR_reg_t var, reg, new_reg;
  MIR_insn_t insn, def_insn, use_insn;
  ssa_edge_t ssa_edge;
  insn_var_iterator_t iter;

  insn = bb_insn->insn;
  FOREACH_OUT_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
    if (var <= MAX_HARD_REG) continue;
    ssa_edge = insn->ops[op_num].data;
    if (ssa_edge != NULL && ssa_edge->flag) continue; /* already processed */
    DEBUG (2, {
      fprintf (debug_file, "  Start def insn %-5lu", (long unsigned) bb_insn->index);
      print_bb_insn (gen_ctx, bb_insn, FALSE);
    });
    reg = var;
    new_reg = get_new_ssa_reg (gen_ctx, reg, '@', FALSE);
    if (ssa_edge == NULL) { /* special case: unused output */
      if (new_reg != MIR_NON_VAR)
        rename_op_reg (gen_ctx, &insn->ops[op_num], reg, new_reg, insn, TRUE);
      continue;
    }
    VARR_TRUNC (ssa_edge_t, ssa_edges_to_process, 0);
    process_insn_to_rename (gen_ctx, insn, op_num);
    if (new_reg != MIR_NON_VAR) {
      while (pop_to_rename (gen_ctx, &ssa_edge)) {
        def_insn = ssa_edge->def->insn;
        use_insn = ssa_edge->use->insn;
        rename_op_reg (gen_ctx, &def_insn->ops[ssa_edge->def_op_num], reg, new_reg, def_insn, TRUE);
        rename_op_reg (gen_ctx, &use_insn->ops[ssa_edge->use_op_num], reg, new_reg, use_insn, TRUE);
      }
    }
  }
}